

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O2

RotationXX<std::complex<float>_> *
qclab::qgates::operator/
          (RotationXX<std::complex<float>_> *__return_storage_ptr__,
          RotationXX<std::complex<float>_> *lhs,RotationXX<std::complex<float>_> *rhs)

{
  int iVar1;
  angle_type aVar2;
  int iVar3;
  
  iVar1 = (lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems[0];
  iVar3 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar1 == iVar3) {
    RotationXX<std::complex<float>_>::operator/=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_;
    aVar2 = (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems =
         *(undefined8 *)(lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).rotation_.angle_ = aVar2;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).
    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004cebc0;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationXX.hpp"
                ,0xd2,"RotationXX<T> qclab::qgates::operator/(RotationXX<T>, const RotationXX<T> &)"
               );
}

Assistant:

RotationXX< T > operator/( RotationXX< T > lhs ,
                                         const RotationXX< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }